

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::ConstraintsBiLoad_C
          (ChLinkMotorLinearDriveline *this,double factor,double recovery_clamp,bool do_clamp)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000031,do_clamp);
  ChLinkMateGeneric::ConstraintsBiLoad_C((ChLinkMateGeneric *)this,factor,recovery_clamp,do_clamp);
  peVar1 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x33])
            (factor,recovery_clamp,peVar1,uVar3 & 0xffffffff);
  peVar1 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x33])
            (factor,recovery_clamp,peVar1,uVar3 & 0xffffffff);
  peVar2 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x33])
            (factor,recovery_clamp,peVar2,uVar3 & 0xffffffff);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    // First, inherit to parent class
    ChLinkMotorLinear::ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);

    innerconstraint1lin->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
    innerconstraint2lin->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
    innerconstraint2rot->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
}